

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O1

void TTD::NSLogEvents::
     JsRTVarAndIntegralArgumentsAction_InternalUse_Parse<(TTD::NSLogEvents::EventKind)45,1ul,1ul>
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  int iVar1;
  TTDVar pvVar2;
  undefined4 extraout_var;
  
  if (evt->EventKind == HasPropertyActionTag) {
    (*reader->_vptr_FileReader[3])(reader,0x12,1);
    pvVar2 = NSSnapValues::ParseTTDVar(false,reader);
    *(TTDVar *)(evt + 1) = pvVar2;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    pvVar2 = NSSnapValues::ParseTTDVar(false,reader);
    evt[1].EventTimeStamp = (int64)pvVar2;
    iVar1 = (*reader->_vptr_FileReader[0xd])(reader,1);
    evt[2].EventKind = iVar1;
    evt[2].ResultStatus = extraout_var;
    (*reader->_vptr_FileReader[5])(reader);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTVarAndIntegralArgumentsAction_InternalUse_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTVarAndIntegralArgumentsAction_InternalUse<vcount, icount>* vAction = GetInlineEventDataAs<JsRTVarAndIntegralArgumentsAction_InternalUse<vcount, icount>, tag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            vAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            reader->ReadSequenceStart_WDefaultKey(true);
            for(size_t i = 0; i < vcount; ++i)
            {
                vAction->VarArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
            }

            for(size_t i = 0; i < icount; ++i)
            {
                vAction->ScalarArray[i] = reader->ReadNakedInt64(vcount + i != 0);
            }
            reader->ReadSequenceEnd();
        }